

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::handleResize(Private *this,usize newWidth)

{
  String local_38;
  
  promptClear(this);
  this->stdoutScreenWidth = newWidth;
  local_38.data = &String::emptyData.super_Data;
  promptWrite(this,0,&local_38);
  String::~String(&local_38);
  return;
}

Assistant:

void handleResize(usize newWidth)
  {
    promptClear();
    stdoutScreenWidth = newWidth;
    promptWrite();
  }